

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void duckdb::ThrowForeignKeyConstraintError
               (idx_t failed_index,bool is_append,Index *conflict_index,DataChunk *input)

{
  ConstraintException *this;
  undefined7 in_register_00000031;
  string message;
  
  (*conflict_index->_vptr_Index[0x16])
            (&message,conflict_index,(ulong)(2 - (int)CONCAT71(in_register_00000031,is_append)),
             failed_index,input);
  this = (ConstraintException *)__cxa_allocate_exception(0x10);
  ConstraintException::ConstraintException(this,&message);
  __cxa_throw(this,&ConstraintException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] static void ThrowForeignKeyConstraintError(idx_t failed_index, bool is_append, Index &conflict_index,
                                                        DataChunk &input) {
	// The index that caused the conflict has to be bound by this point (or we would not have gotten here)
	D_ASSERT(conflict_index.IsBound());
	auto &index = conflict_index.Cast<BoundIndex>();
	auto verify_type = is_append ? VerifyExistenceType::APPEND_FK : VerifyExistenceType::DELETE_FK;
	D_ASSERT(failed_index != DConstants::INVALID_INDEX);
	auto message = index.GetConstraintViolationMessage(verify_type, failed_index, input);
	throw ConstraintException(message);
}